

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *this,size_t n,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int num_thread,
          double gamma,bool writeEach,bool progress,float perc_elem_loaded)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bitVector *pbVar4;
  uint64_t offset;
  int ii;
  long lVar5;
  EVP_PKEY_CTX *ctx;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  HashFunctors<unsigned_long>::HashFunctors((HashFunctors<unsigned_long> *)(this + 0x20));
  *(double *)(this + 0x88) = gamma;
  auVar11._8_4_ = (int)(n >> 0x20);
  auVar11._0_8_ = n;
  auVar11._12_4_ = 0x45300000;
  dVar7 = ceil(((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * gamma);
  *(long *)(this + 0x90) = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7
  ;
  *(size_t *)(this + 0x98) = n;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_boomphf::SingleHashFunctor<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_boomphf::SingleHashFunctor<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(this + 0xa0));
  *(undefined4 *)(this + 0x138) = 0;
  *(mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> **)(this + 0x160) = this + 0x170;
  *(undefined8 *)(this + 0x168) = 0;
  this[0x170] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0;
  *(undefined8 *)(this + 0x1a8) = 0;
  *(undefined8 *)(this + 0x1b0) = 0;
  *(undefined8 *)(this + 0x1b8) = 0;
  *(undefined8 *)(this + 0x1c0) = 0;
  *(undefined8 *)(this + 0x1c8) = 0;
  *(undefined8 *)(this + 0x1d0) = 0;
  *(int *)(this + 0x1e4) = num_thread;
  *(float *)(this + 0x218) = perc_elem_loaded;
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x240) = 0;
  *(undefined8 *)(this + 0x248) = 0;
  this[0x254] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)progress;
  if (n == 0) {
    return;
  }
  this[0x21c] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)
                (!writeEach && 0.0 < perc_elem_loaded);
  this[0x256] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)writeEach;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
            ((mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)this);
  if (this[0x254] != (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1)
  goto LAB_0010ac9d;
  *(undefined4 *)(this + 0x138) = 1;
  iVar1 = *(int *)(this + 0x18);
  dVar12 = 1.0 / (1.0 - *(double *)(this + 0x1f0)) + 1.0;
  iVar2 = *(int *)(this + 0x250);
  dVar7 = pow(*(double *)(this + 0x1f0),(double)iVar2);
  dVar7 = (double)(int)(~*(uint *)(this + 0x250) + *(int *)(this + 0x18)) * dVar7 +
          (double)(iVar2 + 1);
  printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n"
         ,dVar12,dVar7,(double)iVar1);
  if (writeEach) {
    auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)*(undefined8 *)(this + 0x98));
    auVar8._8_4_ = (int)((ulong)*(undefined8 *)(this + 0x98) >> 0x20);
    auVar8._12_4_ = 0x45300000;
    dVar10 = (auVar8._8_8_ - 1.9342813113834067e+25) + (auVar8._0_8_ - 4503599627370496.0);
    dVar7 = dVar12;
LAB_0010ac5e:
    uVar3 = (ulong)(dVar7 * dVar10);
    ctx = (EVP_PKEY_CTX *)
          ((long)(dVar7 * dVar10 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
  }
  else {
    lVar6 = *(long *)(this + 0x98);
    if (this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
      auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = 0x45300000;
      dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      goto LAB_0010ac5e;
    }
    ctx = (EVP_PKEY_CTX *)(lVar6 * *(int *)(this + 0x18));
  }
  Progress::init((Progress *)(this + 0x138),ctx);
LAB_0010ac9d:
  lVar6 = 0x10;
  offset = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x18); lVar5 = lVar5 + 1) {
    pbVar4 = (bitVector *)operator_new(0x30);
    bitVector::bitVector(pbVar4,*(uint64_t *)(*(long *)this + -8 + lVar6));
    *(bitVector **)(this + 0x80) = pbVar4;
    processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              (this,input_range,(int)lVar5);
    bitVector::clearCollisions
              ((bitVector *)(*(long *)this + lVar6),0,*(size_t *)(*(long *)this + -8 + lVar6),
               *(bitVector **)(this + 0x80));
    offset = bitVector::build_ranks((bitVector *)(*(long *)this + lVar6),offset);
    pbVar4 = *(bitVector **)(this + 0x80);
    if (pbVar4 != (bitVector *)0x0) {
      bitVector::~bitVector(pbVar4);
    }
    operator_delete(pbVar4);
    lVar6 = lVar6 + 0x40;
  }
  if (this[0x254] != (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0) {
    Progress::finish_threaded((Progress *)(this + 0x138));
  }
  *(uint64_t *)(this + 0x1f8) = offset;
  local_48._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 0x220);
  local_48._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this + 0x228);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(this + 0x230);
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  pthread_mutex_destroy((pthread_mutex_t *)(this + 0x268));
  this[0x255] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1;
  return;
}

Assistant:

mphf( size_t n, Range const& input_range,int num_thread = 1,  double gamma = 2.0 , bool writeEach = true, bool progress =true, float perc_elem_loaded = 0.03) :
		_gamma(gamma), _hash_domain(size_t(ceil(double(n) * gamma))), _nelem(n), _num_thread(num_thread), _percent_elem_loaded_for_fastMode (perc_elem_loaded), _withprogress(progress)
		{
			if(n ==0) return;
			
			_fastmode = false;
			

			
			if(_percent_elem_loaded_for_fastMode > 0.0 )
				_fastmode =true;

			
			if(writeEach)
			{
				_writeEachLevel =true;
				_fastmode = false;
			}
			else
			{
				_writeEachLevel = false;
			}
			
			setup();

			if(_withprogress)
			{
				_progressBar.timer_mode=1;
				
				
				double total_raw = _nb_levels;
				
				double sum_geom_read =  ( 1.0 / (1.0 - _proba_collision));
				double total_writeEach = sum_geom_read + 1.0;

				double total_fastmode_ram =  (_fastModeLevel+1) +  ( pow(_proba_collision,_fastModeLevel)) * (_nb_levels-(_fastModeLevel+1))   ;
				
				printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n",total_writeEach,_fastModeLevel,total_fastmode_ram,total_raw);

				if(writeEach)
				{
					_progressBar.init(_nelem * total_writeEach,"Building BooPHF",num_thread);
				}
				else if(_fastmode)
					_progressBar.init( _nelem * total_fastmode_ram    ,"Building BooPHF",num_thread);
				else
					_progressBar.init( _nelem * _nb_levels ,"Building BooPHF",num_thread);
			}

			uint64_t offset = 0;
			for(int ii = 0; ii< _nb_levels; ii++)
			{
				_tempBitset =  new bitVector(_levels[ii].hash_domain); // temp collision bitarray for this level

				processLevel(input_range,ii);

				_levels[ii].bitset.clearCollisions(0 , _levels[ii].hash_domain , _tempBitset);
				
				offset = _levels[ii].bitset.build_ranks(offset);

				delete _tempBitset;
			}

			if(_withprogress)
			_progressBar.finish_threaded();


			_lastbitsetrank = offset ;

			//printf("used temp ram for construction : %lli MB \n",setLevelFastmode.capacity()* sizeof(elem_t) /1024ULL/1024ULL);

			std::vector<elem_t>().swap(setLevelFastmode);   // clear setLevelFastmode reallocating


			pthread_mutex_destroy(&_mutex);
			
			_built = true;
		}